

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ConcurrentSSBOAtomicCounterMixedCase::
genAtomicCounterComputeSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  Context *context;
  char *in_RCX;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream buf;
  ConcurrentSSBOAtomicCounterMixedCase *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"${GLSL_VERSION_DECL}\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main ()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tatomicCounterIncrement(u_counter);\n");
  std::operator<<(poVar1,"}");
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,context,in_RCX);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ConcurrentSSBOAtomicCounterMixedCase::genAtomicCounterComputeSource (void) const
{
	std::ostringstream buf;

	buf	<< "${GLSL_VERSION_DECL}\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "\n"
		<< "layout (binding = 2, offset = 0) uniform atomic_uint u_counter;\n"
		<< "\n"
		<< "void main ()\n"
		<< "{\n"
		<< "	atomicCounterIncrement(u_counter);\n"
		<< "}";

	return specializeShader(m_context, buf.str().c_str());
}